

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::checkInFlightQueriesForDisconnect(CommonCore *this)

{
  bool bVar1;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  __tuple_element_t<1UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *this_01;
  size_type sVar2;
  reference pvVar3;
  __tuple_element_t<2UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *p_Var4;
  long in_RDI;
  int ii;
  string str;
  __tuple_element_t<1UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *requesters;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *builder;
  tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
  *builderData;
  iterator __end1;
  iterator __begin1;
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  *__range1;
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  *in_stack_ffffffffffffff68;
  JsonMapBuilder *in_stack_ffffffffffffff70;
  GlobalBrokerId in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  SmallBuffer *in_stack_ffffffffffffff98;
  int local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  int index;
  __normal_iterator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_*,_std::vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>_>
  local_18;
  long local_10;
  
  local_10 = in_RDI + 0xad0;
  local_18._M_current =
       (tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
        *)std::
          vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
          ::begin(in_stack_ffffffffffffff68);
  std::
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_*,_std::vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>_>
                      ((__normal_iterator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_*,_std::vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_*,_std::vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_*,_std::vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>_>
    ::operator*(&local_18);
    this_00 = (DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 get<0ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                           ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                             *)0x48c95a);
    this_01 = std::
              get<1ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                        ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                          *)0x48c969);
    bVar1 = fileops::JsonMapBuilder::isCompleted(in_stack_ffffffffffffff70);
    if (bVar1) break;
    bVar1 = fileops::JsonMapBuilder::clearComponents(in_stack_ffffffffffffff70);
    if (bVar1) {
      fileops::JsonMapBuilder::generate_abi_cxx11_((JsonMapBuilder *)in_stack_ffffffffffffff98);
      for (local_5c = 0;
          sVar2 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::size
                            (this_01), local_5c < (int)sVar2 + -1; local_5c = local_5c + 1) {
        pvVar3 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
                 operator[](this_01,(long)local_5c);
        bVar1 = GlobalFederateId::operator==
                          (&pvVar3->dest_id,(GlobalBrokerId)*(BaseType *)(in_RDI + 0x14));
        if (bVar1) {
          std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                    (this_01,(long)local_5c);
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::setDelayedValue(this_00,(int)((ulong)this_01 >> 0x20),in_stack_ffffffffffffffc0);
        }
        else {
          std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                    (this_01,(long)local_5c);
          SmallBuffer::operator=
                    (in_stack_ffffffffffffff98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90.gid));
          std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                    (this_01,(long)local_5c);
          routeMessage((CommonCore *)__begin1._M_current,(ActionMessage *)__end1._M_current);
        }
      }
      pvVar3 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                         ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                          in_stack_ffffffffffffff70);
      index = (int)((ulong)this_01 >> 0x20);
      in_stack_ffffffffffffff90.gid = *(BaseType *)(in_RDI + 0x14);
      bVar1 = GlobalFederateId::operator==(&pvVar3->dest_id,in_stack_ffffffffffffff90);
      if (bVar1) {
        in_stack_ffffffffffffff70 = (JsonMapBuilder *)(in_RDI + 0x998);
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   in_stack_ffffffffffffff70);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::setDelayedValue(this_00,index,in_stack_ffffffffffffffc0);
      }
      else {
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   in_stack_ffffffffffffff70);
        SmallBuffer::operator=
                  (in_stack_ffffffffffffff98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90.gid));
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   in_stack_ffffffffffffff70);
        routeMessage((CommonCore *)__begin1._M_current,(ActionMessage *)__end1._M_current);
      }
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x48cb46);
      p_Var4 = std::
               get<2ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                         ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                           *)0x48cb50);
      if (*p_Var4 == DISABLED) {
        fileops::JsonMapBuilder::reset(in_stack_ffffffffffffff70);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff70);
    }
    __gnu_cxx::
    __normal_iterator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_*,_std::vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void CommonCore::checkInFlightQueriesForDisconnect()
{
    for (auto& builderData : mapBuilders) {
        auto& builder = std::get<0>(builderData);
        auto& requesters = std::get<1>(builderData);
        if (builder.isCompleted()) {
            return;
        }
        if (builder.clearComponents()) {
            auto str = builder.generate();
            for (int ii = 0; ii < static_cast<int>(requesters.size()) - 1; ++ii) {
                if (requesters[ii].dest_id == global_broker_id_local) {
                    activeQueries.setDelayedValue(requesters[ii].messageID, str);
                } else {
                    requesters[ii].payload = str;
                    routeMessage(std::move(requesters[ii]));
                }
            }
            if (requesters.back().dest_id == global_broker_id_local) {
                activeQueries.setDelayedValue(requesters.back().messageID, std::move(str));
            } else {
                requesters.back().payload = std::move(str);
                routeMessage(std::move(requesters.back()));
            }

            requesters.clear();
            if (std::get<2>(builderData) == QueryReuse::DISABLED) {
                builder.reset();
            }
        }
    }
}